

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

value_type * __thiscall
poplar::
map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
::update(map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
         *this,char_range key)

{
  uint32_t uVar1;
  bool bVar2;
  ulong uVar3;
  value_type *pvVar4;
  undefined8 *puVar5;
  byte bVar6;
  char *pcVar7;
  uint32_t uVar8;
  ulong uVar9;
  byte *pbVar10;
  pair<const_int_*,_unsigned_long> pVar11;
  char_range local_320;
  byte *local_310;
  uint64_t node_id;
  
  local_320.end = key.end;
  pbVar10 = key.begin;
  local_320.begin = pbVar10;
  if (pbVar10 == local_320.end) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar5 = &PTR__exception_00189a50;
    pcVar7 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:122:key must be a non-empty string."
    ;
  }
  else {
    if (local_320.end[-1] == 0) {
      if ((this->hash_trie_).size_ == 0) {
        if (this->is_ready_ == false) {
          map((map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
               *)&node_id,0,0x20);
          operator=(this,(map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
                          *)&node_id);
          ~map((map<poplar::compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_fkhash_nlm<int,_64UL>_>
                *)&node_id);
        }
        this->size_ = this->size_ + 1;
        (this->hash_trie_).size_ = 1;
LAB_0016e723:
        pvVar4 = compact_fkhash_nlm<int,_64UL>::append(&this->label_store_,&local_320);
      }
      else {
        node_id = 0;
        local_310 = local_320.end;
        while( true ) {
          local_320.begin = pbVar10;
          local_320.end = local_310;
          pVar11 = compact_fkhash_nlm<int,_64UL>::compare(&this->label_store_,node_id,&local_320);
          uVar9 = pVar11.second;
          pvVar4 = pVar11.first;
          if ((pbVar10 == local_310) || (pvVar4 != (value_type *)0x0)) break;
          local_320.begin = local_320.begin + uVar9;
          uVar3 = this->lambda_;
          for (; uVar3 <= uVar9; uVar9 = uVar9 - uVar3) {
            bVar2 = compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                    ::add_child(&this->hash_trie_,&node_id,0xff);
            if (bVar2) {
              compact_fkhash_nlm<int,_64UL>::append_dummy(&this->label_store_);
            }
            uVar3 = this->lambda_;
          }
          bVar6 = (this->codes_)._M_elems[*local_320.begin];
          if (bVar6 == 0xff) {
            uVar1 = this->num_codes_;
            uVar8 = uVar1 + 1;
            this->num_codes_ = uVar8;
            (this->codes_)._M_elems[*local_320.begin] = (uchar)uVar1;
            if (uVar8 == 0xff) {
              puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
              *puVar5 = &PTR__exception_00189a50;
              pcVar7 = 
              "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:171:"
              ;
              goto LAB_0016e789;
            }
            bVar6 = (this->codes_)._M_elems[*local_320.begin];
          }
          bVar2 = compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                  ::add_child(&this->hash_trie_,&node_id,uVar9 << 8 | (ulong)bVar6);
          pbVar10 = local_320.begin + 1;
          if (bVar2) {
            this->size_ = this->size_ + 1;
            local_320.begin = pbVar10;
            goto LAB_0016e723;
          }
          local_310 = local_320.end;
        }
      }
      return pvVar4;
    }
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar5 = &PTR__exception_00189a50;
    pcVar7 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:123:The last character of key must be the null terminator."
    ;
  }
LAB_0016e789:
  puVar5[1] = pcVar7;
  __cxa_throw(puVar5,&exception::typeinfo,std::exception::~exception);
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }